

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
::destroy_slots(raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
                *this)

{
  size_t sVar1;
  long lVar2;
  size_t i;
  size_t sVar3;
  Layout LVar4;
  
  sVar1 = this->capacity_;
  if (sVar1 != 0) {
    lVar2 = 0;
    for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
      if (-1 < this->ctrl_[sVar3]) {
        Person::~Person((Person *)((long)&(this->slots_->_first)._M_dataplus._M_p + lVar2));
      }
      lVar2 = lVar2 + 0x48;
    }
    LVar4 = MakeLayout(this->capacity_);
    Deallocate<8ul,std::allocator<Person>>
              ((allocator<Person> *)&this->settings_,this->ctrl_,
               LVar4.super_LayoutType<sizeof___(Ts),_signed_char,_Person>.size_[1] * 0x48 +
               (LVar4.super_LayoutType<sizeof___(Ts),_signed_char,_Person>.size_[0] + 7 &
               0xfffffffffffffff8));
    this->ctrl_ = EmptyGroup<std::is_same<std::allocator<Person>,std::allocator<Person>>>()::
                  empty_group;
    (this->settings_).
    super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
    this->slots_ = (slot_type *)0x0;
    this->size_ = 0;
    this->capacity_ = 0;
  }
  return;
}

Assistant:

void destroy_slots() {
        if (!capacity_)
            return;
        
        PHMAP_IF_CONSTEXPR((!std::is_trivially_destructible<typename PolicyTraits::value_type>::value ||
                            std::is_same<typename Policy::is_flat, std::false_type>::value)) {
            // node map, or not trivially destructible... we  need to iterate and destroy values one by one
            // std::cout << "either this is a node map or " << type_name<typename PolicyTraits::value_type>()  << " is not trivially_destructible\n";
            for (size_t i = 0, cnt = capacity_; i != cnt; ++i) {
                if (IsFull(ctrl_[i])) {
                    PolicyTraits::destroy(&alloc_ref(), slots_ + i);
                }
            }
        } 
        auto layout = MakeLayout(capacity_);
        // Unpoison before returning the memory to the allocator.
        SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
        Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
        ctrl_ = EmptyGroup<std_alloc_t>();
        slots_ = nullptr;
        size_ = 0;
        capacity_ = 0;
        growth_left() = 0;
    }